

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

double __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
                  *this)

{
  BinaryReader<mp::internal::IdentityConverter> *pBVar1;
  char *pcVar2;
  int opcode;
  double dVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  local_18.field_1.values_ = (Value *)&local_28;
  pBVar1 = this->reader_;
  pcVar2 = (pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (pBVar1->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
  (pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
  switch(*pcVar2) {
  case 'l':
  case 'n':
  case 's':
    dVar3 = ReadConstant(this,*pcVar2);
    return dVar3;
  default:
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x26490e,&local_18);
  case 'o':
    opcode = ReadOpCode(this);
    dVar3 = (double)ReadLogicalExpr(this,opcode);
    return dVar3;
  }
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}